

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_ManSimRelCheckFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts,Vec_Wrd_t *vFuncs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  int Values [32];
  ulong local_f0;
  uint auStack_b8 [34];
  
  uVar6 = 1 << ((byte)nOuts & 0x1f);
  uVar11 = (long)vRel->nSize / (long)(int)uVar6;
  iVar2 = (int)uVar11;
  if (vFuncs->nSize != nOuts * iVar2 * 2) {
    __assert_fail("Vec_WrdSize(vFuncs) == 2 * nOuts * nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2f4,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  if (0x20 < nOuts) {
    __assert_fail("nOuts <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2f5,"void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  if (iVar2 < 1) {
    uVar3 = 0;
  }
  else {
    if ((int)uVar6 < 2) {
      uVar6 = 1;
    }
    iVar1 = iVar2 * 0x40;
    if (iVar2 * 0x40 < 2) {
      iVar1 = 1;
    }
    uVar11 = uVar11 & 0xffffffff;
    local_f0 = 0;
    uVar3 = 0;
    do {
      if (0 < nOuts) {
        bVar4 = (byte)local_f0 & 0x3f;
        iVar7 = 0;
        lVar8 = 0;
        uVar9 = 0;
        do {
          if (((int)lVar8 < 0) || (vFuncs->nSize <= iVar7)) {
LAB_007ba535:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          uVar10 = vFuncs->pArray[(local_f0 >> 6) + lVar8] >> bVar4;
          if ((iVar2 + (int)lVar8 < 0) || (vFuncs->nSize <= iVar7 + iVar2)) goto LAB_007ba535;
          uVar12 = vFuncs->pArray[(local_f0 >> 6) + uVar11 + lVar8] & 1L << bVar4;
          if (((((uVar10 & 1) == 0) || (uVar13 = 1, uVar12 != 0)) &&
              (((uVar10 & 1) != 0 || (uVar13 = 2, uVar12 == 0)))) &&
             (((uVar10 & 1) != 0 || (uVar13 = 3, uVar12 != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                          ,0x302,
                          "void Gia_ManSimRelCheckFuncs(Gia_Man_t *, Vec_Wrd_t *, int, Vec_Wrd_t *)"
                         );
          }
          auStack_b8[uVar9] = uVar13;
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + uVar11 * 2;
          iVar7 = iVar7 + iVar2 * 2;
        } while ((uint)nOuts != uVar9);
      }
      if (nOuts != 0x1f) {
        uVar9 = 0;
        do {
          uVar13 = (uint)uVar9;
          if (0 < nOuts) {
            uVar10 = 0;
            do {
              if ((auStack_b8[uVar10] >> ((uVar13 >> ((uint)uVar10 & 0x1f) & 1) != 0) & 1) == 0)
              goto LAB_007ba4b0;
              uVar10 = uVar10 + 1;
            } while ((uint)nOuts != uVar10);
          }
          uVar5 = uVar13 + ((int)local_f0 << ((byte)nOuts & 0x1f));
          if (((vRel->pArray[(int)uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) == 0) &&
             (uVar5 = uVar3 + 1, bVar14 = uVar3 == 0, uVar3 = uVar5, bVar14)) {
            printf("For pattern %d, minterm %d produced by function is not in the relation.\n",
                   local_f0,uVar9);
          }
LAB_007ba4b0:
          uVar9 = (ulong)(uVar13 + 1);
        } while (uVar13 + 1 != uVar6);
      }
      local_f0 = local_f0 + 1;
    } while ((int)local_f0 != iVar1);
  }
  if (uVar3 == 0) {
    puts("The function agrees with the relation.");
    return;
  }
  printf("Total number of similar errors = %d.\n",(ulong)uVar3);
  return;
}

Assistant:

void Gia_ManSimRelCheckFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts, Vec_Wrd_t * vFuncs )
{
    int i, k, m, Values[32], nErrors = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    assert( Vec_WrdSize(vFuncs) == 2 * nOuts * nWords );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( k = 0; k < nOuts; k++ )
        {
            int Value0 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
            int Value1 = Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            if ( Value0 && !Value1 )
                Values[k] = 1;
            else if ( !Value0 && Value1 )
                Values[k] = 2;
            else if ( !Value0 && !Value1 )
                Values[k] = 3;
            else assert( 0 );
        }
        for ( m = 0; m < nMints; m++ )
        {
            for ( k = 0; k < nOuts; k++ )
                if ( ((Values[k] >> ((m >> k) & 1)) & 1) == 0 )
                    break;
            if ( k < nOuts )
                continue;
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                continue;
            if ( nErrors++ == 0 )
                printf( "For pattern %d, minterm %d produced by function is not in the relation.\n", i, m );
        }
    }
    if ( nErrors )    
        printf( "Total number of similar errors = %d.\n", nErrors );
    else
        printf( "The function agrees with the relation.\n" );
}